

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parcor_coefficients_to_log_area_ratio.cc
# Opt level: O1

bool __thiscall
sptk::ParcorCoefficientsToLogAreaRatio::Run
          (ParcorCoefficientsToLogAreaRatio *this,
          vector<double,_std::allocator<double>_> *parcor_coefficients,
          vector<double,_std::allocator<double>_> *log_area_ratio)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  size_type __new_size;
  double *pdVar4;
  double dVar5;
  
  if (this->is_valid_ == true) {
    bVar3 = false;
    if ((log_area_ratio != (vector<double,_std::allocator<double>_> *)0x0) &&
       (__new_size = (long)this->num_order_ + 1, bVar3 = false,
       (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == __new_size)) {
      if ((long)(log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(log_area_ratio,__new_size);
      }
      pdVar1 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (log_area_ratio->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar4 = *pdVar1;
      bVar3 = true;
      if (this->num_order_ != 0) {
        pdVar2 = (parcor_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        while (pdVar1 = pdVar1 + 1, pdVar1 != pdVar2) {
          pdVar4 = pdVar4 + 1;
          dVar5 = atanh(*pdVar1);
          *pdVar4 = dVar5 + dVar5;
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ParcorCoefficientsToLogAreaRatio::Run(
    const std::vector<double>& parcor_coefficients,
    std::vector<double>* log_area_ratio) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      parcor_coefficients.size() != static_cast<std::size_t>(length) ||
      NULL == log_area_ratio) {
    return false;
  }

  // Prepare memories.
  if (log_area_ratio->size() != static_cast<std::size_t>(length)) {
    log_area_ratio->resize(length);
  }

  // Copy gain.
  (*log_area_ratio)[0] = parcor_coefficients[0];
  if (0 == num_order_) {
    return true;
  }

  std::transform(parcor_coefficients.begin() + 1, parcor_coefficients.end(),
                 log_area_ratio->begin() + 1,
                 [](double k) { return 2.0 * std::atanh(k); });

  return true;
}